

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

void If_CluVerify(word *pF,int nVars,If_Grp_t *g,If_Grp_t *r,word BStruth,word *pFStruth)

{
  char cVar1;
  int iVar2;
  word (*pIn) [1024];
  long lVar3;
  word (*pawVar4) [1024];
  word BStruth_local;
  word pTTRes [1024];
  word pTTWire [1024];
  word pTTFans [6] [1024];
  
  cVar1 = g->nVars;
  BStruth_local = BStruth;
  if ((cVar1 < '\a') && (r->nVars < '\a')) {
    if (TruthAll[0][0] == 0) {
      If_CluInitTruthTables();
      cVar1 = g->nVars;
    }
    pawVar4 = pTTFans;
    for (lVar3 = 0; lVar3 < cVar1; lVar3 = lVar3 + 1) {
      If_CluCopy(*pawVar4,TruthAll[g->pVars[lVar3]],nVars);
      pawVar4 = pawVar4 + 1;
    }
    pawVar4 = pTTFans;
    If_CluComposeLut(nVars,g,&BStruth_local,pawVar4,pTTWire);
    cVar1 = r->nVars;
    for (lVar3 = 0; lVar3 < cVar1; lVar3 = lVar3 + 1) {
      pIn = TruthAll + r->pVars[lVar3];
      if (r->pVars[lVar3] == nVars) {
        pIn = &pTTWire;
      }
      If_CluCopy(*pawVar4,*pIn,nVars);
      pawVar4 = pawVar4 + 1;
    }
    If_CluComposeLut(nVars,r,pFStruth,pTTFans,pTTRes);
    iVar2 = If_CluEqual(pTTRes,pF,nVars);
    if (iVar2 == 0) {
      putchar(10);
      If_CluPrintConfig(nVars,g,r,BStruth,pFStruth);
      Kit_DsdPrintFromTruth((uint *)pTTRes,nVars);
      putchar(10);
      Kit_DsdPrintFromTruth((uint *)pF,nVars);
      putchar(10);
      puts("Verification FAILED!");
    }
    return;
  }
  __assert_fail("g->nVars <= 6 && r->nVars <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                ,0x285,"void If_CluVerify(word *, int, If_Grp_t *, If_Grp_t *, word, word *)");
}

Assistant:

void If_CluVerify( word * pF, int nVars, If_Grp_t * g, If_Grp_t * r, word BStruth, word * pFStruth )
{
    word pTTFans[6][CLU_WRD_MAX], pTTWire[CLU_WRD_MAX], pTTRes[CLU_WRD_MAX];
    int i;
    assert( g->nVars <= 6 && r->nVars <= 6 );

    if ( TruthAll[0][0] == 0 )
        If_CluInitTruthTables();

    for ( i = 0; i < g->nVars; i++ )
        If_CluCopy( pTTFans[i], TruthAll[(int)g->pVars[i]], nVars );
    If_CluComposeLut( nVars, g, &BStruth, pTTFans, pTTWire );

    for ( i = 0; i < r->nVars; i++ )
        if ( r->pVars[i] == nVars )
            If_CluCopy( pTTFans[i], pTTWire, nVars );
        else
            If_CluCopy( pTTFans[i], TruthAll[(int)r->pVars[i]], nVars );
    If_CluComposeLut( nVars, r, pFStruth, pTTFans, pTTRes );

    if ( !If_CluEqual(pTTRes, pF, nVars) )
    {
        printf( "\n" );
        If_CluPrintConfig( nVars, g, r, BStruth, pFStruth );
        Kit_DsdPrintFromTruth( (unsigned*)pTTRes, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
//        Extra_PrintHex( stdout, (unsigned *)pF, nVars ); printf( "\n" );
        printf( "Verification FAILED!\n" );
    }
//    else
//        printf( "Verification succeed!\n" );
}